

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

int __thiscall GGWave::init(GGWave *this,EVP_PKEY_CTX *ctx)

{
  int8_t iVar1;
  int8_t iVar2;
  int8_t iVar3;
  bool bVar4;
  undefined2 uVar5;
  byte bVar6;
  int iVar7;
  GGWave *pGVar8;
  GGWave *extraout_RAX;
  Protocol *pPVar9;
  uchar *puVar10;
  byte *pbVar11;
  GGWave *extraout_RAX_00;
  ProtocolId in_ECX;
  long in_RDX;
  uint in_R8D;
  int i;
  Protocol *protocol;
  int maxLength;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint local_54;
  uint local_4c;
  int local_3c;
  uint local_14;
  undefined1 local_1;
  
  local_14 = (uint)ctx;
  if ((int)local_14 < 0) {
    pGVar8 = this;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      iVar7 = fprintf((anonymous_namespace)::g_fptr,"Negative data size: %d\n",
                      (ulong)ctx & 0xffffffff);
      pGVar8 = (GGWave *)((ulong)(uint3)((uint)iVar7 >> 8) << 8);
    }
    local_1 = 0;
    goto LAB_0010a268;
  }
  if ((this->m_isTxEnabled & 1U) == 0) {
    if ((0 < (int)local_14) && ((anonymous_namespace)::g_fptr != (FILE *)0x0)) {
      fprintf((anonymous_namespace)::g_fptr,
              "Tx is disabled - cannot transmit data with this GGWave instance\n");
    }
  }
  else {
    if ((this->m_isFixedPayloadLength & 1U) == 0) {
      local_4c = 0x8c;
    }
    else {
      local_4c = this->m_payloadLength;
    }
    if ((int)local_4c < (int)local_14) {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        fprintf((anonymous_namespace)::g_fptr,"Truncating data from %d to %d bytes\n",
                (ulong)ctx & 0xffffffff,(ulong)local_4c);
      }
      local_14 = local_4c;
    }
    pGVar8 = (GGWave *)(ulong)local_14;
    if (((int)in_R8D < 0) || (100 < (int)in_R8D)) {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        iVar7 = fprintf((anonymous_namespace)::g_fptr,"Invalid volume: %d\n",(ulong)in_R8D);
        pGVar8 = (GGWave *)((ulong)(uint3)((uint)iVar7 >> 8) << 8);
      }
      local_1 = 0;
      goto LAB_0010a268;
    }
    (this->m_tx).hasData = false;
    ggvector<unsigned_char>::zero((ggvector<unsigned_char> *)0x109ef6);
    ggvector<unsigned_char>::zero((ggvector<unsigned_char> *)0x109f04);
    if (0 < (int)local_14) {
      pGVar8 = extraout_RAX;
      if (-1 < (int)in_ECX) {
        iVar7 = Protocols::size(&(this->m_tx).protocols);
        pGVar8 = (GGWave *)(ulong)in_ECX;
        if ((int)in_ECX < iVar7) {
          pPVar9 = Protocols::operator[](&(this->m_tx).protocols,in_ECX);
          pGVar8 = (GGWave *)0x0;
          if ((pPVar9->enabled & 1U) == 0) {
            if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
              iVar7 = fprintf((anonymous_namespace)::g_fptr,
                              "Protocol %d is not enabled - make sure to enable it before creating the instance\n"
                              ,(ulong)in_ECX);
              pGVar8 = (GGWave *)((ulong)(uint3)((uint)iVar7 >> 8) << 8);
            }
            local_1 = 0;
            goto LAB_0010a268;
          }
          if ((pPVar9->extra == '\x02') &&
             (pGVar8 = (GGWave *)0x0, (this->m_isFixedPayloadLength & 1U) == 0)) {
            if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
              iVar7 = fprintf((anonymous_namespace)::g_fptr,
                              "Mono-tone protocols with variable length are not supported\n");
              pGVar8 = (GGWave *)((ulong)(uint3)((uint)iVar7 >> 8) << 8);
            }
            local_1 = 0;
            goto LAB_0010a268;
          }
          (this->m_tx).protocol.name = pPVar9->name;
          iVar1 = pPVar9->framesPerTx;
          iVar2 = pPVar9->bytesPerTx;
          iVar3 = pPVar9->extra;
          bVar4 = pPVar9->enabled;
          uVar5 = *(undefined2 *)&pPVar9->field_0xe;
          (this->m_tx).protocol.freqStart = pPVar9->freqStart;
          (this->m_tx).protocol.framesPerTx = iVar1;
          (this->m_tx).protocol.bytesPerTx = iVar2;
          (this->m_tx).protocol.extra = iVar3;
          (this->m_tx).protocol.enabled = bVar4;
          *(undefined2 *)&(this->m_tx).protocol.field_0xe = uVar5;
          if ((this->m_isFixedPayloadLength & 1U) == 0) {
            local_54 = local_14;
          }
          else {
            local_54 = this->m_payloadLength;
          }
          (this->m_tx).dataLength = local_54;
          (this->m_tx).sendVolume = (float)(int)in_R8D / 100.0;
          iVar7 = (this->m_tx).dataLength;
          puVar10 = ggvector<unsigned_char>::operator[](&(this->m_tx).data,0);
          *puVar10 = (uchar)iVar7;
          for (local_3c = 0; local_3c < (this->m_tx).dataLength; local_3c = local_3c + 1) {
            if (local_3c < (int)local_14) {
              in_stack_ffffffffffffffa4 = (int)*(char *)(in_RDX + local_3c);
            }
            else {
              in_stack_ffffffffffffffa4 = 0;
            }
            in_stack_ffffffffffffffa0 =
                 CONCAT13((char)in_stack_ffffffffffffffa4,(int3)in_stack_ffffffffffffffa0);
            puVar10 = ggvector<unsigned_char>::operator[](&(this->m_tx).data,local_3c + 1);
            *puVar10 = (uchar)((uint)in_stack_ffffffffffffffa0 >> 0x18);
            if ((this->m_isDSSEnabled & 1U) != 0) {
              bVar6 = anon_unknown.dwarf_1d8e::getDSSMagic(local_3c);
              pbVar11 = ggvector<unsigned_char>::operator[](&(this->m_tx).data,local_3c + 1);
              *pbVar11 = *pbVar11 ^ bVar6;
            }
          }
          (this->m_tx).hasData = true;
          goto LAB_0010a1ac;
        }
      }
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        iVar7 = fprintf((anonymous_namespace)::g_fptr,"Invalid protocol ID: %d\n",(ulong)in_ECX);
        pGVar8 = (GGWave *)((ulong)(uint3)((uint)iVar7 >> 8) << 8);
      }
      local_1 = 0;
      goto LAB_0010a268;
    }
  }
LAB_0010a1ac:
  pGVar8 = this;
  if ((this->m_isRxEnabled & 1U) != 0) {
    (this->m_rx).receiving = false;
    (this->m_rx).analyzing = false;
    (this->m_rx).framesToAnalyze = 0;
    (this->m_rx).framesLeftToAnalyze = 0;
    (this->m_rx).framesToRecord = 0;
    (this->m_rx).framesLeftToRecord = 0;
    ggvector<float>::zero((ggvector<float> *)0x10a206);
    ggvector<float>::zero((ggvector<float> *)0x10a21b);
    ggmatrix<float>::zero
              ((ggmatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ggvector<unsigned_char>::zero((ggvector<unsigned_char> *)0x10a24b);
    ggmatrix<unsigned_char>::zero
              ((ggmatrix<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    pGVar8 = extraout_RAX_00;
  }
  local_1 = 1;
LAB_0010a268:
  return (int)CONCAT71((int7)((ulong)pGVar8 >> 8),local_1);
}

Assistant:

bool GGWave::init(int dataSize, const char * dataBuffer, TxProtocolId protocolId, const int volume) {
    if (dataSize < 0) {
        ggprintf("Negative data size: %d\n", dataSize);
        return false;
    }

    // Tx
    if (m_isTxEnabled) {
        const auto maxLength = m_isFixedPayloadLength ? m_payloadLength : kMaxLengthVariable;

        if (dataSize > maxLength) {
            ggprintf("Truncating data from %d to %d bytes\n", dataSize, maxLength);
            dataSize = maxLength;
        }

        if (volume < 0 || volume > 100) {
            ggprintf("Invalid volume: %d\n", volume);
            return false;
        }

        m_tx.hasData = false;
        m_tx.data.zero();
        m_dataEncoded.zero();

        if (dataSize > 0) {
            if (protocolId < 0 || protocolId >= m_tx.protocols.size()) {
                ggprintf("Invalid protocol ID: %d\n", protocolId);
                return false;
            }

            const auto & protocol = m_tx.protocols[protocolId];

            if (protocol.enabled == false) {
                ggprintf("Protocol %d is not enabled - make sure to enable it before creating the instance\n", protocolId);
                return false;
            }

            if (protocol.extra == 2 && m_isFixedPayloadLength == false) {
                ggprintf("Mono-tone protocols with variable length are not supported\n");
                return false;
            }

            m_tx.protocol   = protocol;
            m_tx.dataLength = m_isFixedPayloadLength ? m_payloadLength : dataSize;
            m_tx.sendVolume = ((double)(volume))/100.0f;

            m_tx.data[0] = m_tx.dataLength;
            for (int i = 0; i < m_tx.dataLength; ++i) {
                m_tx.data[i + 1] = i < dataSize ? dataBuffer[i] : 0;
                if (m_isDSSEnabled) {
                    m_tx.data[i + 1] ^= getDSSMagic(i);
                }
            }

            m_tx.hasData = true;
        }
    } else {
        if (dataSize > 0) {
            ggprintf("Tx is disabled - cannot transmit data with this GGWave instance\n");
        }
    }

    // Rx
    if (m_isRxEnabled) {
        m_rx.receiving = false;
        m_rx.analyzing = false;

        m_rx.framesToAnalyze = 0;
        m_rx.framesLeftToAnalyze = 0;
        m_rx.framesToRecord = 0;
        m_rx.framesLeftToRecord = 0;

        m_rx.spectrum.zero();
        m_rx.amplitude.zero();
        m_rx.amplitudeHistory.zero();

        m_rx.data.zero();

        m_rx.spectrumHistoryFixed.zero();
    }

    return true;
}